

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O2

void testMinMaxEigenValueImp<double>(void)

{
  Matrix44<double> MStack_88;
  
  Imath_3_2::Matrix33<double>::Matrix33((Matrix33<double> *)&MStack_88,&A33_7);
  testMinMaxEigenValue<Imath_3_2::Matrix33<double>>((Matrix33<double> *)&MStack_88);
  Imath_3_2::Matrix33<double>::Matrix33((Matrix33<double> *)&MStack_88,&A33_8);
  testMinMaxEigenValue<Imath_3_2::Matrix33<double>>((Matrix33<double> *)&MStack_88);
  Imath_3_2::Matrix44<double>::Matrix44(&MStack_88,&A44_7);
  testMinMaxEigenValue<Imath_3_2::Matrix44<double>>(&MStack_88);
  Imath_3_2::Matrix44<double>::Matrix44(&MStack_88,&A44_8);
  testMinMaxEigenValue<Imath_3_2::Matrix44<double>>(&MStack_88);
  return;
}

Assistant:

void
testMinMaxEigenValueImp ()
{
    testMinMaxEigenValue (Matrix33<T> (A33_7));
    testMinMaxEigenValue (Matrix33<T> (A33_8));

    testMinMaxEigenValue (Matrix44<T> (A44_7));
    testMinMaxEigenValue (Matrix44<T> (A44_8));
}